

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O1

int compression_code_zstd(archive *a,la_zstream *lastrm,la_zaction action)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  ZSTD_inBuffer in;
  ZSTD_outBuffer out;
  uint8_t *local_50;
  size_t local_48;
  long local_40;
  uint8_t *local_38;
  size_t local_30;
  long local_28;
  
  local_38 = lastrm->next_out;
  local_30 = lastrm->avail_out;
  local_28 = 0;
  local_50 = lastrm->next_in;
  local_48 = lastrm->avail_in;
  local_40 = 0;
  lVar3 = ZSTD_compressStream2
                    (lastrm->real_stream,&local_38,&local_50,(action != ARCHIVE_Z_RUN) * '\x02');
  iVar1 = ZSTD_isError(lVar3);
  if (iVar1 == 0) {
    lastrm->next_in = lastrm->next_in + local_40;
    lastrm->avail_in = lastrm->avail_in - local_40;
    lastrm->total_in = lastrm->total_in + local_40;
    lastrm->next_out = lastrm->next_out + local_28;
    lastrm->avail_out = lastrm->avail_out - local_28;
    lastrm->total_out = lastrm->total_out + local_28;
    uVar2 = (uint)(lVar3 == 0 && action == ARCHIVE_Z_FINISH);
  }
  else {
    uVar4 = ZSTD_getErrorName(lVar3);
    archive_set_error(a,-1,"zstd compression failed, ZSTD_compressStream2 returned: %s",uVar4);
    uVar2 = 0xffffffe2;
  }
  return uVar2;
}

Assistant:

static int
compression_code_zstd(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	ZSTD_CStream *strm = (ZSTD_CStream *)lastrm->real_stream;

	ZSTD_outBuffer out = { .dst = lastrm->next_out, .size = lastrm->avail_out, .pos = 0 };
	ZSTD_inBuffer  in  = { .src = lastrm->next_in,  .size = lastrm->avail_in,  .pos = 0 };

	size_t zret;

	ZSTD_EndDirective mode = (action == ARCHIVE_Z_RUN) ? ZSTD_e_continue : ZSTD_e_end;

	zret = ZSTD_compressStream2(strm, &out, &in, mode);
	if (ZSTD_isError(zret)) {
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
			"zstd compression failed, ZSTD_compressStream2 returned: %s",
			ZSTD_getErrorName(zret));
		return (ARCHIVE_FATAL);
	}

	lastrm->next_in += in.pos;
	lastrm->avail_in -= in.pos;
	lastrm->total_in += in.pos;

	lastrm->next_out += out.pos;
	lastrm->avail_out -= out.pos;
	lastrm->total_out += out.pos;

	if (action == ARCHIVE_Z_FINISH && zret == 0)
		return (ARCHIVE_EOF); // All done.

	return (ARCHIVE_OK); // More work to do.
}